

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int execSqlF(sqlite3 *db,char **pzErrMsg,char *zSql,...)

{
  char in_AL;
  int iVar1;
  char *zSql_00;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_f8.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_f8.gp_offset = 0x18;
  local_f8.fp_offset = 0x30;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  zSql_00 = sqlite3VMPrintf(db,zSql,&local_f8);
  if (zSql_00 == (char *)0x0) {
    iVar1 = 7;
  }
  else {
    iVar1 = execSql(db,pzErrMsg,zSql_00);
    sqlite3DbFreeNN(db,zSql_00);
  }
  return iVar1;
}

Assistant:

static int execSqlF(sqlite3 *db, char **pzErrMsg, const char *zSql, ...){
  char *z;
  va_list ap;
  int rc;
  va_start(ap, zSql);
  z = sqlite3VMPrintf(db, zSql, ap);
  va_end(ap);
  if( z==0 ) return SQLITE_NOMEM;
  rc = execSql(db, pzErrMsg, z);
  sqlite3DbFree(db, z);
  return rc;
}